

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_129::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_129 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  iterator ppcVar3;
  uint index;
  iterator ppcVar4;
  Reader RVar5;
  ArrayPtr<const_char> local_c0;
  ListElementCount local_ac;
  Fault f;
  undefined1 in_stack_ffffffffffffff80 [16];
  BuilderFor<capnp::DynamicList> list;
  
  ppcVar3 = expected._M_array;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,(Builder *)this);
  if ((iterator)(ulong)list.builder.elementCount != ppcVar3) {
    local_c0.ptr = (char *)ppcVar3;
    local_ac = list.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x14a,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               (unsigned_long *)&local_c0,&local_ac);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (ppcVar3 != (iterator)0x0) {
    ppcVar4 = (iterator)0x0;
    do {
      __s = *(char **)(&reader->type + (long)ppcVar4 * 2);
      index = (uint)ppcVar4;
      DynamicList::Builder::operator[]((Builder *)&f,&list,index);
      DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Builder *)&f);
      RVar5 = name((DynamicEnum)in_stack_ffffffffffffff80);
      sVar2 = strlen(__s);
      if (RVar5.super_StringPtr.content.size_ == sVar2 + 1) {
        iVar1 = bcmp(RVar5.super_StringPtr.content.ptr,__s,RVar5.super_StringPtr.content.size_ - 1);
        DynamicValue::Builder::~Builder((Builder *)&f);
        if (iVar1 != 0) goto joined_r0x002558b7;
      }
      else {
        DynamicValue::Builder::~Builder((Builder *)&f);
joined_r0x002558b7:
        if (kj::_::Debug::minSeverity < 3) {
          DynamicList::Builder::operator[]((Builder *)&f,&list,index);
          DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Builder *)&f);
          local_c0 = (ArrayPtr<const_char>)name((DynamicEnum)in_stack_ffffffffffffff80);
          kj::_::Debug::log<char_const(&)[85],char_const*const&,capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x14c,ERROR,
                     "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                     ,(char (*) [85])
                      "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                     ,(char **)(&reader->type + (long)ppcVar4 * 2),(Reader *)&local_c0);
          DynamicValue::Builder::~Builder((Builder *)&f);
        }
      }
      ppcVar4 = (iterator)(ulong)(index + 1);
    } while (ppcVar4 < ppcVar3);
  }
  return;
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}